

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O1

pair<QDate,_QTime> getDateTime(QDateTimeData *d)

{
  QDateTimePrivate *pQVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  pair<QDate,_QTime> pVar9;
  
  pQVar1 = d->d;
  if (((ulong)pQVar1 & 1) == 0) {
    uVar3 = (pQVar1->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
            super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
  }
  else {
    uVar3 = (uint)pQVar1;
  }
  if (((ulong)pQVar1 & 1) == 0) {
    uVar5 = pQVar1->m_msecs;
  }
  else {
    uVar5 = (long)pQVar1 >> 8;
  }
  if ((long)uVar5 < 0) {
    lVar6 = uVar5 + 1;
    lVar8 = -(lVar6 >> 0x3f);
    lVar2 = lVar6 / 86400000 + (lVar6 >> 0x3f);
    uVar7 = (lVar2 + lVar8) - 1;
    uVar4 = (int)lVar6 + ((int)lVar2 + (int)lVar8) * -86400000 + 86399999;
  }
  else {
    uVar7 = uVar5 / 86400000;
    uVar4 = (int)uVar5 + (int)uVar7 * -86400000;
  }
  lVar2 = -0x8000000000000000;
  if ((uVar3 & 2) != 0) {
    lVar2 = uVar7 + 0x253d8c;
  }
  pVar9.second.mds = -(uint)((uVar3 & 4) == 0) | uVar4;
  pVar9.first.jd = lVar2;
  pVar9._12_4_ = 0;
  return pVar9;
}

Assistant:

inline bool QDateTime::Data::isShort() const
{
    bool b = quintptr(d) & QDateTimePrivate::ShortData;

    // sanity check:
    Q_ASSERT(b || !d->m_status.testFlag(QDateTimePrivate::ShortData));

    // even if CanBeSmall = false, we have short data for a default-constructed
    // QDateTime object. But it's unlikely.
    if constexpr (CanBeSmall)
        return Q_LIKELY(b);
    return Q_UNLIKELY(b);
}